

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

void lj_meta_for(lua_State *L,TValue *o)

{
  int iVar1;
  long in_RSI;
  undefined4 in_stack_ffffffffffffffc8;
  ErrMsg in_stack_ffffffffffffffcc;
  ushort in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 in_stack_ffffffffffffffd3;
  bool bVar2;
  undefined1 in_stack_ffffffffffffffd4;
  undefined1 in_stack_ffffffffffffffd5;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 uVar4;
  
  uVar4 = true;
  if ((0xfffeffff < *(uint *)(in_RSI + 4)) &&
     (in_stack_ffffffffffffffd6 = false, uVar4 = in_stack_ffffffffffffffd6,
     *(int *)(in_RSI + 4) == -5)) {
    iVar1 = lj_strscan_num((GCstr *)CONCAT17(1,(uint7)CONCAT15(in_stack_ffffffffffffffd5,
                                                               CONCAT14(in_stack_ffffffffffffffd4,
                                                                        CONCAT13(
                                                  in_stack_ffffffffffffffd3,
                                                  CONCAT12(in_stack_ffffffffffffffd2,
                                                           in_stack_ffffffffffffffd0))))),
                           (TValue *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    in_stack_ffffffffffffffd6 = iVar1 != 0;
    uVar4 = in_stack_ffffffffffffffd6;
  }
  if ((bool)uVar4 == false) {
    lj_err_msg((lua_State *)
               (ulong)CONCAT16(in_stack_ffffffffffffffd6,
                               CONCAT15(in_stack_ffffffffffffffd5,
                                        CONCAT14(in_stack_ffffffffffffffd4,
                                                 CONCAT13(in_stack_ffffffffffffffd3,
                                                          CONCAT12(in_stack_ffffffffffffffd2,
                                                                   in_stack_ffffffffffffffd0))))),
               in_stack_ffffffffffffffcc);
  }
  uVar3 = true;
  if ((0xfffeffff < *(uint *)(in_RSI + 0xc)) &&
     (in_stack_ffffffffffffffd4 = false, uVar3 = in_stack_ffffffffffffffd4,
     *(int *)(in_RSI + 0xc) == -5)) {
    iVar1 = lj_strscan_num((GCstr *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffd6,
                                                            CONCAT15(1,(uint5)CONCAT13(
                                                  in_stack_ffffffffffffffd3,
                                                  CONCAT12(in_stack_ffffffffffffffd2,
                                                           in_stack_ffffffffffffffd0))))),
                           (TValue *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    in_stack_ffffffffffffffd4 = iVar1 != 0;
    uVar3 = in_stack_ffffffffffffffd4;
  }
  if ((bool)uVar3 != false) {
    bVar2 = true;
    if ((0xfffeffff < *(uint *)(in_RSI + 0x14)) &&
       (in_stack_ffffffffffffffd2 = false, bVar2 = (bool)in_stack_ffffffffffffffd2,
       *(int *)(in_RSI + 0x14) == -5)) {
      iVar1 = lj_strscan_num((GCstr *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffd6,
                                                              CONCAT15(uVar3,CONCAT14(
                                                  in_stack_ffffffffffffffd4,
                                                  CONCAT13(1,(uint3)in_stack_ffffffffffffffd0))))),
                             (TValue *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                            );
      in_stack_ffffffffffffffd2 = iVar1 != 0;
      bVar2 = (bool)in_stack_ffffffffffffffd2;
    }
    if (bVar2 != false) {
      return;
    }
    lj_err_msg((lua_State *)
               CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffd6,
                                       CONCAT15(uVar3,CONCAT14(in_stack_ffffffffffffffd4,
                                                               (uint)CONCAT12(
                                                  in_stack_ffffffffffffffd2,
                                                  in_stack_ffffffffffffffd0))))),
               in_stack_ffffffffffffffcc);
  }
  lj_err_msg((lua_State *)
             CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffd6,
                                     (uint6)CONCAT14(in_stack_ffffffffffffffd4,
                                                     CONCAT13(in_stack_ffffffffffffffd3,
                                                              CONCAT12(in_stack_ffffffffffffffd2,
                                                                       in_stack_ffffffffffffffd0))))
                     ),in_stack_ffffffffffffffcc);
}

Assistant:

void LJ_FASTCALL lj_meta_for(lua_State *L, TValue *o)
{
  if (!lj_strscan_numberobj(o)) lj_err_msg(L, LJ_ERR_FORINIT);
  if (!lj_strscan_numberobj(o+1)) lj_err_msg(L, LJ_ERR_FORLIM);
  if (!lj_strscan_numberobj(o+2)) lj_err_msg(L, LJ_ERR_FORSTEP);
  if (LJ_DUALNUM) {
    /* Ensure all slots are integers or all slots are numbers. */
    int32_t k[3];
    int nint = 0;
    ptrdiff_t i;
    for (i = 0; i <= 2; i++) {
      if (tvisint(o+i)) {
	k[i] = intV(o+i); nint++;
      } else {
	k[i] = lj_num2int(numV(o+i)); nint += ((lua_Number)k[i] == numV(o+i));
      }
    }
    if (nint == 3) {  /* Narrow to integers. */
      setintV(o, k[0]);
      setintV(o+1, k[1]);
      setintV(o+2, k[2]);
    } else if (nint != 0) {  /* Widen to numbers. */
      if (tvisint(o)) setnumV(o, (lua_Number)intV(o));
      if (tvisint(o+1)) setnumV(o+1, (lua_Number)intV(o+1));
      if (tvisint(o+2)) setnumV(o+2, (lua_Number)intV(o+2));
    }
  }
}